

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

void reed_solomon_find_error_values(correct_reed_solomon *rs)

{
  uint uVar1;
  field_element_t *pfVar2;
  field_logarithm_t *pfVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  int iVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  size_t sVar11;
  field_element_t fVar12;
  field_element_t r;
  byte bVar13;
  ulong uVar14;
  ulong uVar15;
  uint i;
  ulong uVar16;
  ulong uVar17;
  polynomial_t l;
  polynomial_t poly;
  polynomial_t poly_00;
  polynomial_t poly_01;
  polynomial_t r_00;
  polynomial_t der;
  
  sVar11 = rs->min_distance;
  pfVar2 = rs->syndromes;
  memset((rs->error_evaluator).coeff,0,(ulong)((rs->error_evaluator).order + 1));
  uVar4 = (rs->error_locator).coeff;
  uVar5 = (rs->error_locator).order;
  l.order = uVar5;
  l.coeff = (field_element_t *)uVar4;
  l._12_4_ = 0;
  r_00.order = (int)sVar11 + -1;
  r_00.coeff = pfVar2;
  r_00._12_4_ = 0;
  polynomial_mul(rs->field,l,r_00,rs->error_evaluator);
  uVar1 = (rs->error_locator).order;
  der.order = uVar1 - 1;
  (rs->error_locator_derivative).order = der.order;
  poly.order = uVar1;
  poly.coeff = (rs->error_locator).coeff;
  poly._12_4_ = 0;
  der.coeff = (rs->error_locator_derivative).coeff;
  der._12_4_ = 0;
  polynomial_formal_derivative(rs->field,poly,der);
  for (uVar16 = 0; uVar16 < (rs->error_locator).order; uVar16 = uVar16 + 1) {
    uVar15 = (ulong)rs->error_roots[uVar16];
    if (uVar15 != 0) {
      uVar17 = (long)(int)((uint)(rs->field).log[uVar15] * (rs->first_consecutive_root - 1)) % 0xff;
      iVar6 = (int)uVar17;
      uVar14 = (ulong)(iVar6 + 0xff);
      if (-1 < iVar6) {
        uVar14 = uVar17 & 0xffffffff;
      }
      uVar17 = (ulong)(rs->field).exp[uVar14];
      uVar7 = (rs->error_evaluator).coeff;
      uVar8 = (rs->error_evaluator).order;
      poly_00.order = uVar8;
      poly_00.coeff = (field_element_t *)uVar7;
      poly_00._12_4_ = 0;
      fVar12 = polynomial_eval_lut(rs->field,poly_00,rs->element_exp[uVar15]);
      uVar9 = (rs->error_locator_derivative).coeff;
      uVar10 = (rs->error_locator_derivative).order;
      poly_01.order = uVar10;
      poly_01.coeff = (field_element_t *)uVar9;
      poly_01._12_4_ = 0;
      r = polynomial_eval_lut(rs->field,poly_01,rs->element_exp[rs->error_roots[uVar16]]);
      pfVar2 = (rs->field).exp;
      pfVar3 = (rs->field).log;
      bVar13 = field_div(rs->field,fVar12,r);
      fVar12 = '\0';
      if ((uVar17 != 0) && (fVar12 = '\0', bVar13 != 0)) {
        fVar12 = pfVar2[(ulong)pfVar3[bVar13] + (ulong)pfVar3[uVar17]];
      }
      rs->error_vals[uVar16] = fVar12;
    }
  }
  return;
}

Assistant:

void reed_solomon_find_error_values(correct_reed_solomon *rs) {
    // error value e(j) = -(X(j)^(1-c) * omega(X(j)^-1))/(lambda'(X(j)^-1))
    // where X(j)^-1 is a root of the error locator, omega(X) is the error evaluator,
    //   lambda'(X) is the first formal derivative of the error locator,
    //   and c is the first consecutive root of the generator used in encoding

    // first find omega(X), the error evaluator
    // we generate S(x), the polynomial constructed from the roots of the syndromes
    // this is *not* the polynomial constructed by expanding the products of roots
    // S(x) = S(1) + S(2)*x + ... + S(2t)*x(2t - 1)
    polynomial_t syndrome_poly;
    syndrome_poly.order = rs->min_distance - 1;
    syndrome_poly.coeff = rs->syndromes;
    memset(rs->error_evaluator.coeff, 0, (rs->error_evaluator.order + 1) * sizeof(field_element_t));
    reed_solomon_find_error_evaluator(rs->field, rs->error_locator, syndrome_poly, rs->error_evaluator);

    // now find lambda'(X)
    rs->error_locator_derivative.order = rs->error_locator.order - 1;
    polynomial_formal_derivative(rs->field, rs->error_locator, rs->error_locator_derivative);

    // calculate each e(j)
    for (unsigned int i = 0; i < rs->error_locator.order; i++) {
        if (rs->error_roots[i] == 0) {
            continue;
        }
        rs->error_vals[i] = field_mul(
            rs->field, field_pow(rs->field, rs->error_roots[i], rs->first_consecutive_root - 1),
            field_div(
                rs->field, polynomial_eval_lut(rs->field, rs->error_evaluator, rs->element_exp[rs->error_roots[i]]),
                polynomial_eval_lut(rs->field, rs->error_locator_derivative, rs->element_exp[rs->error_roots[i]])));
    }
}